

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

pool_ptr<soul::heart::OutputDeclaration> __thiscall
soul::Module::findOutput(Module *this,string_view name)

{
  string_view other;
  bool bVar1;
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  *this_00;
  reference this_01;
  OutputDeclaration *pOVar2;
  char *in_RCX;
  pool_ref<soul::heart::OutputDeclaration> *f;
  const_iterator __end1;
  const_iterator __begin1;
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  *__range1;
  Module *this_local;
  string_view name_local;
  
  this_00 = (vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
             *)(name._M_len + 0x88);
  __end1 = std::
           vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
           ::begin(this_00);
  f = (pool_ref<soul::heart::OutputDeclaration> *)
      std::
      vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
                                *)&f);
    if (!bVar1) {
      pool_ptr<soul::heart::OutputDeclaration>::pool_ptr
                ((pool_ptr<soul::heart::OutputDeclaration> *)this);
      return (pool_ptr<soul::heart::OutputDeclaration>)(OutputDeclaration *)this;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<const_soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
              ::operator*(&__end1);
    pOVar2 = pool_ref<soul::heart::OutputDeclaration>::operator->(this_01);
    other._M_str = in_RCX;
    other._M_len = (size_t)name._M_str;
    bVar1 = Identifier::operator==(&(pOVar2->super_IODeclaration).name,other);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
    ::operator++(&__end1);
  }
  pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
  return (pool_ptr<soul::heart::OutputDeclaration>)(OutputDeclaration *)this;
}

Assistant:

pool_ptr<heart::OutputDeclaration> Module::findOutput (std::string_view name) const
{
    for (auto& f : outputs)
        if (f->name == name)
            return f;

    return {};
}